

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_openmem(void **buffptr,size_t *buffsize,size_t deltasize,
               _func_void_ptr_void_ptr_size_t *memrealloc,int *handle)

{
  memdriver *pmVar1;
  long lVar2;
  
  *handle = -1;
  pmVar1 = memTable;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 10000) {
      return 0x67;
    }
    if (pmVar1->memaddrptr == (char **)0x0) break;
    lVar2 = lVar2 + 1;
    pmVar1 = pmVar1 + 1;
  }
  *handle = (int)lVar2;
  pmVar1->memaddrptr = (char **)buffptr;
  pmVar1->memsizeptr = buffsize;
  pmVar1->deltasize = deltasize;
  pmVar1->fitsfilesize = *buffsize;
  pmVar1->currentpos = 0;
  pmVar1->mem_realloc = memrealloc;
  return 0;
}

Assistant:

int mem_openmem(void **buffptr,   /* I - address of memory pointer          */
                size_t *buffsize, /* I - size of buffer, in bytes           */
                size_t deltasize, /* I - increment for future realloc's     */
                void *(*memrealloc)(void *p, size_t newsize),  /* function  */
                int *handle)
/* 
  lowest level routine to open a pre-existing memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    memTable[ii].memaddrptr = (char **) buffptr; /* pointer to start addres */
    memTable[ii].memsizeptr = buffsize;     /* allocated size of memory */
    memTable[ii].deltasize = deltasize;     /* suggested realloc increment */
    memTable[ii].fitsfilesize = *buffsize;  /* size of FITS file (upper limit) */
    memTable[ii].currentpos = 0;            /* at beginning of the file */
    memTable[ii].mem_realloc = memrealloc;  /* memory realloc function */
    return(0);
}